

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_build_interintra_predictor
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t *pred,int stride,BUFFER_SET *ctx,int plane,
               BLOCK_SIZE bsize)

{
  uint8_t *dst;
  uint8_t intrapredictor [16384];
  uint8_t local_8038 [32776];
  
  if ((xd->cur_buf->flags & 8) == 0) {
    av1_build_intra_predictors_for_interintra(cm,xd,bsize,plane,ctx,local_8038,0x80);
    dst = local_8038;
  }
  else {
    dst = (uint8_t *)((ulong)local_8038 >> 1);
    av1_build_intra_predictors_for_interintra(cm,xd,bsize,plane,ctx,dst,0x80);
  }
  av1_combine_interintra(xd,bsize,plane,pred,stride,dst,0x80);
  return;
}

Assistant:

void av1_build_interintra_predictor(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                    uint8_t *pred, int stride,
                                    const BUFFER_SET *ctx, int plane,
                                    BLOCK_SIZE bsize) {
  assert(bsize < BLOCK_SIZES_ALL);
  if (is_cur_buf_hbd(xd)) {
    DECLARE_ALIGNED(16, uint16_t, intrapredictor[MAX_SB_SQUARE]);
    av1_build_intra_predictors_for_interintra(
        cm, xd, bsize, plane, ctx, CONVERT_TO_BYTEPTR(intrapredictor),
        MAX_SB_SIZE);
    av1_combine_interintra(xd, bsize, plane, pred, stride,
                           CONVERT_TO_BYTEPTR(intrapredictor), MAX_SB_SIZE);
  } else {
    DECLARE_ALIGNED(16, uint8_t, intrapredictor[MAX_SB_SQUARE]);
    av1_build_intra_predictors_for_interintra(cm, xd, bsize, plane, ctx,
                                              intrapredictor, MAX_SB_SIZE);
    av1_combine_interintra(xd, bsize, plane, pred, stride, intrapredictor,
                           MAX_SB_SIZE);
  }
}